

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void Update_Chan_Algo4_LFO(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  if (CH->SLOT[2].Ecnt == 0x20000000) {
    if (CH->SLOT[3].Ecnt == 0x20000000 || length == 0) {
      return;
    }
  }
  else if (length == 0) {
    return;
  }
  uVar11 = 0;
  do {
    iVar6 = CH->SLOT[0].Fcnt;
    YM2612->in0 = iVar6;
    iVar9 = CH->SLOT[2].Fcnt;
    YM2612->in1 = iVar9;
    iVar2 = CH->SLOT[1].Fcnt;
    YM2612->in2 = iVar2;
    iVar3 = CH->SLOT[3].Fcnt;
    YM2612->in3 = iVar3;
    uVar7 = YM2612->LFO_FREQ_UP[uVar11] * CH->FMS;
    if (uVar7 < 0x200) {
      CH->SLOT[0].Fcnt = iVar6 + CH->SLOT[0].Finc;
      CH->SLOT[2].Fcnt = iVar9 + CH->SLOT[2].Finc;
      CH->SLOT[1].Fcnt = iVar2 + CH->SLOT[1].Finc;
      iVar6 = CH->SLOT[3].Finc;
    }
    else {
      iVar8 = (int)uVar7 >> 9;
      iVar4 = CH->SLOT[0].Finc;
      iVar5 = CH->SLOT[1].Finc;
      CH->SLOT[0].Fcnt = iVar6 + iVar4 + (iVar4 * iVar8 >> 9);
      iVar6 = CH->SLOT[2].Finc;
      CH->SLOT[2].Fcnt = iVar9 + iVar6 + (iVar6 * iVar8 >> 9);
      CH->SLOT[1].Fcnt = iVar2 + iVar5 + (iVar5 * iVar8 >> 9);
      iVar6 = CH->SLOT[3].Finc;
      iVar6 = (iVar8 * iVar6 >> 9) + iVar6;
    }
    CH->SLOT[3].Fcnt = iVar6 + iVar3;
    iVar6 = YM2612->LFO_ENV_UP[uVar11];
    if ((CH->SLOT[0].SEG & 4) == 0) {
      YM2612->en0 = (iVar6 >> ((byte)CH->SLOT[0].AMS & 0x1f)) +
                    CH->SLOT[0].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)];
    }
    else {
      uVar7 = CH->SLOT[0].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)];
      YM2612->en0 = uVar7;
      if ((int)uVar7 < 0x1000) {
        YM2612->en0 = (iVar6 >> ((byte)CH->SLOT[0].AMS & 0x1f)) + (uVar7 ^ 0xfff);
      }
      else {
        YM2612->en0 = 0;
      }
    }
    if ((CH->SLOT[2].SEG & 4) == 0) {
      bVar1 = (byte)CH->SLOT[2].AMS;
      uVar7 = ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)] + CH->SLOT[2].TLL;
LAB_00136cd2:
      YM2612->en1 = (iVar6 >> (bVar1 & 0x1f)) + uVar7;
    }
    else {
      uVar7 = ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)] + CH->SLOT[2].TLL;
      YM2612->en1 = uVar7;
      if ((int)uVar7 < 0x1000) {
        bVar1 = (byte)CH->SLOT[2].AMS;
        uVar7 = uVar7 ^ 0xfff;
        goto LAB_00136cd2;
      }
      YM2612->en1 = 0;
    }
    if ((CH->SLOT[1].SEG & 4) == 0) {
      YM2612->en2 = (iVar6 >> ((byte)CH->SLOT[1].AMS & 0x1f)) +
                    CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
    }
    else {
      uVar7 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      YM2612->en2 = uVar7;
      if ((int)uVar7 < 0x1000) {
        YM2612->en2 = (iVar6 >> ((byte)CH->SLOT[1].AMS & 0x1f)) + (uVar7 ^ 0xfff);
      }
      else {
        YM2612->en2 = 0;
      }
    }
    if ((CH->SLOT[3].SEG & 4) == 0) {
      iVar6 = (iVar6 >> ((byte)CH->SLOT[3].AMS & 0x1f)) +
              CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
LAB_00136dc8:
      YM2612->en3 = iVar6;
    }
    else {
      uVar7 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
      YM2612->en3 = uVar7;
      if ((int)uVar7 < 0x1000) {
        iVar6 = (iVar6 >> ((byte)CH->SLOT[3].AMS & 0x1f)) + (uVar7 ^ 0xfff);
        goto LAB_00136dc8;
      }
      YM2612->en3 = 0;
    }
    iVar6 = CH->SLOT[0].Ecnt + CH->SLOT[0].Einc;
    CH->SLOT[0].Ecnt = iVar6;
    if (CH->SLOT[0].Ecmp <= iVar6) {
      (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
    }
    iVar6 = CH->SLOT[2].Ecnt + CH->SLOT[2].Einc;
    CH->SLOT[2].Ecnt = iVar6;
    if (CH->SLOT[2].Ecmp <= iVar6) {
      (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
    }
    iVar6 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
    CH->SLOT[1].Ecnt = iVar6;
    if (CH->SLOT[1].Ecmp <= iVar6) {
      (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
    }
    iVar6 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
    CH->SLOT[3].Ecnt = iVar6;
    if (CH->SLOT[3].Ecmp <= iVar6) {
      (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
    }
    YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
    iVar6 = CH->S0_OUT[0];
    CH->S0_OUT[1] = iVar6;
    CH->S0_OUT[0] =
         *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                 (long)YM2612->en0 * 4);
    uVar7 = iVar6 + YM2612->in1;
    YM2612->in1 = uVar7;
    uVar10 = YM2612->in3 +
             *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in2 >> 0xb & 0x7ff8)) +
                     (long)YM2612->en2 * 4);
    YM2612->in3 = uVar10;
    iVar6 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar7 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en1 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar10 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en3 * 4) >> 0xf;
    CH->OUTd = iVar6;
    iVar9 = 0x2fff;
    if ((0x2fff < iVar6) || (iVar9 = -0x2fff, iVar6 < -0x2fff)) {
      CH->OUTd = iVar9;
    }
    (*buf)[uVar11] = (*buf)[uVar11] + (CH->LEFT & CH->OUTd);
    buf[1][uVar11] = buf[1][uVar11] + (CH->RIGHT & CH->OUTd);
    uVar11 = uVar11 + 1;
    if (length + (length == 0) == uVar11) {
      return;
    }
  } while( true );
}

Assistant:

static void Update_Chan_Algo4_LFO(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if ((CH->SLOT[S1].Ecnt == ENV_END) && (CH->SLOT[S3].Ecnt == ENV_END))
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 4 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_4
    DO_OUTPUT
  }
}